

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

TimeZoneFormat * __thiscall
icu_63::TimeZoneFormat::operator=(TimeZoneFormat *this,TimeZoneFormat *other)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint in_EAX;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  UVector **ppUVar6;
  UErrorCode status;
  undefined8 uStack_28;
  
  if (this != other) {
    uStack_28._0_4_ = in_EAX;
    if (this->fTimeZoneNames != (TimeZoneNames *)0x0) {
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[1])();
    }
    if (this->fTimeZoneGenericNames != (TimeZoneGenericNames *)0x0) {
      (*this->fTimeZoneGenericNames->_vptr_TimeZoneGenericNames[1])();
    }
    this->fTimeZoneGenericNames = (TimeZoneGenericNames *)0x0;
    if (this->fTZDBTimeZoneNames != (TZDBTimeZoneNames *)0x0) {
      (*(this->fTZDBTimeZoneNames->super_TimeZoneNames).super_UObject._vptr_UObject[1])();
    }
    this->fTZDBTimeZoneNames = (TZDBTimeZoneNames *)0x0;
    Locale::operator=(&this->fLocale,&other->fLocale);
    *(undefined4 *)this->fTargetRegion = *(undefined4 *)other->fTargetRegion;
    iVar4 = (*(other->fTimeZoneNames->super_UObject)._vptr_UObject[4])();
    this->fTimeZoneNames = (TimeZoneNames *)CONCAT44(extraout_var,iVar4);
    if (other->fTimeZoneGenericNames != (TimeZoneGenericNames *)0x0) {
      iVar4 = (*other->fTimeZoneGenericNames->_vptr_TimeZoneGenericNames[4])();
      this->fTimeZoneGenericNames = (TimeZoneGenericNames *)CONCAT44(extraout_var_00,iVar4);
    }
    UnicodeString::operator=(&this->fGMTPattern,&other->fGMTPattern);
    UnicodeString::operator=(&this->fGMTPatternPrefix,&other->fGMTPatternPrefix);
    UnicodeString::operator=(&this->fGMTPatternSuffix,&other->fGMTPatternSuffix);
    uStack_28 = (ulong)(uint)uStack_28;
    ppUVar6 = this->fGMTOffsetPatternItems;
    lVar5 = 0x280;
    do {
      UnicodeString::operator=
                ((UnicodeString *)((this->super_Format).actualLocale + lVar5 + -8),
                 (UnicodeString *)((other->super_Format).actualLocale + lVar5 + -8));
      if (*ppUVar6 != (UVector *)0x0) {
        (*((*ppUVar6)->super_UObject)._vptr_UObject[1])();
      }
      *ppUVar6 = (UVector *)0x0;
      ppUVar6 = ppUVar6 + 1;
      lVar5 = lVar5 + 0x40;
    } while (lVar5 != 0x400);
    initGMTOffsetPatterns(this,(UErrorCode *)((long)&uStack_28 + 4));
    UnicodeString::operator=(&this->fGMTZeroFormat,&other->fGMTZeroFormat);
    uVar1 = *(undefined8 *)(other->fGMTOffsetDigits + 2);
    uVar2 = *(undefined8 *)(other->fGMTOffsetDigits + 4);
    uVar3 = *(undefined8 *)(other->fGMTOffsetDigits + 6);
    *(undefined8 *)this->fGMTOffsetDigits = *(undefined8 *)other->fGMTOffsetDigits;
    *(undefined8 *)(this->fGMTOffsetDigits + 2) = uVar1;
    *(undefined8 *)(this->fGMTOffsetDigits + 4) = uVar2;
    *(undefined8 *)(this->fGMTOffsetDigits + 6) = uVar3;
    *(undefined8 *)(this->fGMTOffsetDigits + 8) = *(undefined8 *)(other->fGMTOffsetDigits + 8);
    this->fDefParseOptionFlags = other->fDefParseOptionFlags;
  }
  return this;
}

Assistant:

TimeZoneFormat&
TimeZoneFormat::operator=(const TimeZoneFormat& other) {
    if (this == &other) {
        return *this;
    }

    delete fTimeZoneNames;
    delete fTimeZoneGenericNames;
    fTimeZoneGenericNames = NULL;
    delete fTZDBTimeZoneNames;
    fTZDBTimeZoneNames = NULL;

    fLocale = other.fLocale;
    uprv_memcpy(fTargetRegion, other.fTargetRegion, sizeof(fTargetRegion));

    fTimeZoneNames = other.fTimeZoneNames->clone();
    if (other.fTimeZoneGenericNames) {
        // TODO: this test has dubious thread safety.
        fTimeZoneGenericNames = other.fTimeZoneGenericNames->clone();
    }

    fGMTPattern = other.fGMTPattern;
    fGMTPatternPrefix = other.fGMTPatternPrefix;
    fGMTPatternSuffix = other.fGMTPatternSuffix;

    UErrorCode status = U_ZERO_ERROR;
    for (int32_t i = 0; i < UTZFMT_PAT_COUNT; i++) {
        fGMTOffsetPatterns[i] = other.fGMTOffsetPatterns[i];
        delete fGMTOffsetPatternItems[i];
        fGMTOffsetPatternItems[i] = NULL;
    }
    initGMTOffsetPatterns(status);
    U_ASSERT(U_SUCCESS(status));

    fGMTZeroFormat = other.fGMTZeroFormat;

    uprv_memcpy(fGMTOffsetDigits, other.fGMTOffsetDigits, sizeof(fGMTOffsetDigits));

    fDefParseOptionFlags = other.fDefParseOptionFlags;

    return *this;
}